

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_kv_cursor_seek(unqlite_kv_cursor *pCursor,void *pKey,int nKeyLen,int iPos)

{
  int iVar1;
  
  if (nKeyLen < 0) {
    nKeyLen = SyStrlen((char *)pKey);
  }
  if (nKeyLen != 0) {
    iVar1 = (*pCursor->pStore->pIo->pMethods->xSeek)(pCursor,pKey,nKeyLen,iPos);
    return iVar1;
  }
  return -3;
}

Assistant:

int unqlite_kv_cursor_seek(unqlite_kv_cursor *pCursor,const void *pKey,int nKeyLen,int iPos)
{
	int rc = UNQLITE_OK;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	if( nKeyLen < 0 ){
		/* Assume a null terminated string and compute it's length */
		nKeyLen = SyStrlen((const char *)pKey);
	}
	if( !nKeyLen ){
		rc = UNQLITE_EMPTY;
	}else{
		/* Seek to the desired location */
		rc = pCursor->pStore->pIo->pMethods->xSeek(pCursor,pKey,nKeyLen,iPos);
	}
	return rc;
}